

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

void __thiscall
Tokenizer::registerReplacementInteger(Tokenizer *this,Identifier *identifier,int64_t newValue)

{
  undefined8 value;
  undefined1 local_e8 [8];
  Replacement replacement;
  string local_a0;
  undefined1 local_80 [8];
  Token tok;
  int64_t newValue_local;
  Identifier *identifier_local;
  Tokenizer *this_local;
  
  tok.originalText.field_2._8_8_ = newValue;
  Token::Token((Token *)local_80);
  value = tok.originalText.field_2._8_8_;
  tok.column._0_4_ = 2;
  tinyformat::format<long>(&local_a0,"%d",(long *)(tok.originalText.field_2._M_local_buf + 8));
  Token::setValue<long>((Token *)local_80,value,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  Replacement::Replacement((Replacement *)local_e8);
  Identifier::operator=((Identifier *)local_e8,identifier);
  std::vector<Token,_std::allocator<Token>_>::push_back
            ((vector<Token,_std::allocator<Token>_> *)
             ((long)&replacement.identifier._name.field_2 + 8),(value_type *)local_80);
  std::vector<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_>::push_back
            (&this->replacements,(value_type *)local_e8);
  Replacement::~Replacement((Replacement *)local_e8);
  Token::~Token((Token *)local_80);
  return;
}

Assistant:

void Tokenizer::registerReplacementInteger(const Identifier& identifier, int64_t newValue)
{
	Token tok;
	tok.type = TokenType::Integer;
	tok.setValue(newValue, tfm::format("%d", newValue));

	Replacement replacement;
	replacement.identifier = identifier;
	replacement.value.push_back(tok);

	replacements.push_back(replacement);
}